

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void duckdb::OpenBracket(vector<unsigned_long,_true> *brackets,
                        vector<unsigned_long,_true> *cursor_brackets,idx_t pos,idx_t i)

{
  bool bVar1;
  value_type_conflict1 *in_RCX;
  value_type_conflict1 *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  
  if (in_RDX == in_RCX) {
    bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RSI);
    if (!bVar1) {
      vector<unsigned_long,_true>::clear((vector<unsigned_long,_true> *)0x203f7c);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RSI,in_RDX);
  }
  bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RSI);
  if ((bVar1) &&
     (((value_type_conflict1 *)((long)in_RCX + 1) == in_RDX ||
      ((value_type_conflict1 *)((long)in_RDX + 1) == in_RCX)))) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RSI,in_RDX);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RSI,in_RDX);
  return;
}

Assistant:

static void OpenBracket(vector<idx_t> &brackets, vector<idx_t> &cursor_brackets, idx_t pos, idx_t i) {
	// check if the cursor is at this position
	if (pos == i) {
		// cursor is exactly on this position - always highlight this bracket
		if (!cursor_brackets.empty()) {
			cursor_brackets.clear();
		}
		cursor_brackets.push_back(i);
	}
	if (cursor_brackets.empty() && ((i + 1) == pos || (pos + 1) == i)) {
		// cursor is either BEFORE or AFTER this bracket and we don't have any highlighted bracket yet
		// highlight this bracket
		cursor_brackets.push_back(i);
	}
	brackets.push_back(i);
}